

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O2

mraa_result_t mraa_intel_edison_mmap_write(mraa_gpio_context dev,int value)

{
  uint8_t *puVar1;
  
  puVar1 = mmap_reg + 0x4c;
  if (value != 0) {
    puVar1 = mmap_reg + 0x34;
  }
  *(int *)(puVar1 + (ulong)(dev->pin / 0x20 & 0x3f) * 4) = 1 << ((byte)dev->pin & 0x1f);
  return MRAA_SUCCESS;
}

Assistant:

mraa_result_t
mraa_intel_edison_mmap_write(mraa_gpio_context dev, int value)
{
    uint8_t offset = ((dev->pin / 32) * sizeof(uint32_t));
    uint8_t valoff;

    if (value) {
        valoff = 0x34;
    } else {
        valoff = 0x4c;
    }

    *(volatile uint32_t*) (mmap_reg + offset + valoff) = (uint32_t)(1 << (dev->pin % 32));

    return MRAA_SUCCESS;
}